

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O3

blargg_err_t
read_strs(Data_Reader *in,long size,blargg_vector<char> *chars,blargg_vector<const_char_*> *strs)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  char **ppcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  size_t __size;
  
  __size = size + 1;
  pcVar2 = (char *)realloc(chars->begin_,__size);
  if (__size == 0 || pcVar2 != (char *)0x0) {
    chars->begin_ = pcVar2;
    chars->size_ = __size;
    pcVar2[size] = '\0';
    iVar1 = (*in->_vptr_Data_Reader[3])(in,pcVar2,size);
    pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
    if (pcVar2 == (blargg_err_t)0x0) {
      ppcVar3 = (char **)realloc(strs->begin_,0x400);
      if (ppcVar3 == (char **)0x0) {
LAB_006e37ae:
        pcVar2 = "Out of memory";
      }
      else {
        strs->begin_ = ppcVar3;
        strs->size_ = 0x80;
        uVar6 = 0;
        if (0 < size) {
          sVar5 = 0x80;
          lVar4 = 0;
          iVar1 = 0;
          do {
            ppcVar3 = strs->begin_;
            if ((long)(int)sVar5 <= (long)uVar6) {
              ppcVar3 = (char **)realloc(ppcVar3,uVar6 << 4);
              if (uVar6 != 0 && ppcVar3 == (char **)0x0) goto LAB_006e37ae;
              sVar5 = uVar6 * 2;
              strs->begin_ = ppcVar3;
              strs->size_ = sVar5;
            }
            ppcVar3[uVar6] = chars->begin_ + lVar4;
            lVar4 = (long)iVar1;
            if (lVar4 < size) {
              do {
                if (chars->begin_[lVar4] == '\0') break;
                lVar4 = lVar4 + 1;
              } while (lVar4 < size);
              iVar1 = (int)lVar4;
            }
            uVar6 = uVar6 + 1;
            iVar1 = iVar1 + 1;
            lVar4 = (long)iVar1;
          } while (lVar4 < size);
          ppcVar3 = strs->begin_;
        }
        ppcVar3 = (char **)realloc(ppcVar3,(uVar6 & 0xffffffff) * 8);
        pcVar2 = "Out of memory";
        if ((int)uVar6 == 0 || ppcVar3 != (char **)0x0) {
          strs->begin_ = ppcVar3;
          strs->size_ = uVar6 & 0xffffffff;
          pcVar2 = (blargg_err_t)0x0;
        }
      }
    }
  }
  else {
    pcVar2 = "Out of memory";
  }
  return pcVar2;
}

Assistant:

static blargg_err_t read_strs( Data_Reader& in, long size, blargg_vector<char>& chars,
		blargg_vector<const char*>& strs )
{
	RETURN_ERR( chars.resize( size + 1 ) );
	chars [size] = 0; // in case last string doesn't have terminator
	RETURN_ERR( in.read( &chars [0], size ) );
	
	RETURN_ERR( strs.resize( 128 ) );
	int count = 0;
	for ( int i = 0; i < size; i++ )
	{
		if ( (int) strs.size() <= count )
			RETURN_ERR( strs.resize( count * 2 ) );
		strs [count++] = &chars [i];
		while ( i < size && chars [i] )
			i++;
	}
	
	return strs.resize( count );
}